

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_TestShell::
~TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_TestShell
          (TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_TestShell
           *this)

{
  TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_TestShell *this_local;
  
  ~TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_TestShell(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersMultipleCallsButOneDidntHappen)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    MockCheckedExpectedCall* call = expectations.addFunction("boo");
    call->ignoreOtherParameters();
    call->callWasMade(1);
    call->finalizeActualCallMatch();
    call->ignoreOtherParameters();
    expectations.addFunction("boo")->ignoreOtherParameters();
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("boo").ignoreOtherParameters();
    mock().expectOneCall("boo").ignoreOtherParameters();
    mock().actualCall("boo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}